

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

PAL_ERROR CorUnix::InitializeProcessCommandLine(LPWSTR lpwstrCmdLine,LPWSTR lpwstrFullPath)

{
  errno_t eVar1;
  char16_t *pcVar2;
  size_t sVar3;
  LPWSTR _Dst;
  
  if (lpwstrFullPath == (LPWSTR)0x0) {
LAB_0013fd47:
    free(g_lpwstrCmdLine);
    g_lpwstrCmdLine = lpwstrCmdLine;
    return 0;
  }
  pcVar2 = PAL_wcsrchr(lpwstrFullPath,L'/');
  *pcVar2 = L'\0';
  sVar3 = PAL_wcslen(lpwstrFullPath);
  _Dst = (LPWSTR)InternalMalloc(sVar3 * 2 + 2);
  if (_Dst == (LPWSTR)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      return 8;
    }
  }
  else {
    eVar1 = wcscpy_s((char16_t_conflict *)_Dst,sVar3 + 1,(char16_t_conflict *)lpwstrFullPath);
    if (eVar1 == 0) {
      *pcVar2 = L'/';
      free(g_lpwstrAppDir);
      g_lpwstrAppDir = _Dst;
      goto LAB_0013fd47;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      free(_Dst);
      return 0x54f;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InitializeProcessCommandLine(
    LPWSTR lpwstrCmdLine,
    LPWSTR lpwstrFullPath
)
{
    PAL_ERROR palError = NO_ERROR;
    LPWSTR initial_dir = NULL;

    //
    // Save the command line and initial directory
    //

    if (lpwstrFullPath)
    {
        LPWSTR lpwstr = PAL_wcsrchr(lpwstrFullPath, '/');
        lpwstr[0] = '\0';
        size_t n = PAL_wcslen(lpwstrFullPath) + 1;

        size_t iLen = n;
        initial_dir = reinterpret_cast<LPWSTR>(InternalMalloc(iLen*sizeof(WCHAR)));
        if (NULL == initial_dir)
        {
            ERROR("malloc() failed! (initial_dir) \n");
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto exit;
        }

        if (wcscpy_s(initial_dir, iLen, lpwstrFullPath) != SAFECRT_SUCCESS)
        {
            ERROR("wcscpy_s failed!\n");
            free(initial_dir);
            palError = ERROR_INTERNAL_ERROR;
            goto exit;
        }

        lpwstr[0] = '/';

        free(g_lpwstrAppDir);
        g_lpwstrAppDir = initial_dir;
    }

    free(g_lpwstrCmdLine);
    g_lpwstrCmdLine = lpwstrCmdLine;

exit:
    return palError;
}